

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANMS.cpp
# Opt level: O3

void ANMS(vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keyPoint,
         vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *corners)

{
  pointer pKVar1;
  pointer pKVar2;
  float *pfVar3;
  long lVar4;
  ulong uVar5;
  pointer pKVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float response;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> r;
  vector<float,_std::allocator<float>_> robustResponse;
  float local_9c;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> local_98;
  vector<float,_std::allocator<float>_> local_78;
  KeyPoint local_58;
  vector<cv::KeyPoint,std::allocator<cv::KeyPoint>> *local_38;
  
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_98.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (KeyPoint *)0x0;
  local_98.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (KeyPoint *)0x0;
  pKVar6 = (keyPoint->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pKVar1 = (keyPoint->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_38 = (vector<cv::KeyPoint,std::allocator<cv::KeyPoint>> *)corners;
  if (pKVar6 != pKVar1) {
    local_9c = 0.0;
    do {
      fVar8 = pKVar6->response;
      local_58.pt.x = fVar8 * 0.9;
      if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish ==
          local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (&local_78,
                   (iterator)
                   local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,(float *)&local_58);
      }
      else {
        *local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_58.pt.x;
        local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (fVar8 <= local_9c) {
        fVar8 = local_9c;
      }
      pKVar6 = pKVar6 + 1;
      local_9c = fVar8;
    } while (pKVar6 != pKVar1);
    pKVar6 = (keyPoint->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pKVar1 = (keyPoint->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pKVar6 != pKVar1) {
      do {
        local_58.pt.x = (pKVar6->pt).x;
        local_58.pt.y = (pKVar6->pt).y;
        if (pKVar6->response <= fVar8 * 0.9) {
          pKVar2 = (keyPoint->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          local_58.response = 3.4028235e+38;
          lVar4 = (long)(keyPoint->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pKVar2;
          if (lVar4 != 0) {
            lVar4 = (lVar4 >> 2) * 0x6db6db6db6db6db7;
            pfVar3 = &(pKVar2->pt).y;
            lVar7 = 0;
            fVar9 = 3.4028235e+38;
            do {
              local_58.response = fVar9;
              if ((pKVar6->response <
                   local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar7]) &&
                 (fVar10 = ((Point2f *)(pfVar3 + -1))->x - local_58.pt.x,
                 local_58.response =
                      SQRT(fVar10 * fVar10 + (*pfVar3 - local_58.pt.y) * (*pfVar3 - local_58.pt.y)),
                 fVar9 <= local_58.response)) {
                local_58.response = fVar9;
              }
              lVar7 = lVar7 + 1;
              pfVar3 = pfVar3 + 7;
              fVar9 = local_58.response;
            } while (lVar4 + (ulong)(lVar4 == 0) != lVar7);
          }
          local_58.size = 3.0;
          local_58.angle = -1.0;
          local_58.octave = 0;
          local_58.class_id = -1;
          std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::emplace_back<cv::KeyPoint>
                    (&local_98,&local_58);
        }
        else {
          local_58.size = 3.0;
          local_58.angle = -1.0;
          local_58.response = 3.4028235e+38;
          local_58.octave = 0;
          local_58.class_id = -1;
          std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::emplace_back<cv::KeyPoint>
                    (&local_98,&local_58);
        }
        pKVar6 = pKVar6 + 1;
      } while (pKVar6 != pKVar1);
    }
  }
  pKVar1 = local_98.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pKVar6 = local_98.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_98.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_98.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar5 = ((long)local_98.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_98.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7;
    lVar4 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<cv::KeyPoint*,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(cv::KeyPoint_const&,cv::KeyPoint_const&)>>
              ((__normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
                )local_98.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
                )local_98.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                 super__Vector_impl_data._M_finish,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_cv::KeyPoint_&,_const_cv::KeyPoint_&)>)0x103952);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<cv::KeyPoint*,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(cv::KeyPoint_const&,cv::KeyPoint_const&)>>
              ((__normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
                )pKVar6,(__normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
                         )pKVar1,
               (_Iter_comp_iter<bool_(*)(const_cv::KeyPoint_&,_const_cv::KeyPoint_&)>)0x103952);
  }
  if ((ulong)(((long)local_98.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_98.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7) < 0x1f5) {
    std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cv::KeyPoint*,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>>>
              (local_38,*(undefined8 *)local_38,
               local_98.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_98.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  else {
    std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cv::KeyPoint*,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>>>
              (local_38,*(undefined8 *)local_38,
               local_98.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_98.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
               super__Vector_impl_data._M_start + 499);
  }
  if (local_98.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
      super__Vector_impl_data._M_start != (KeyPoint *)0x0) {
    operator_delete(local_98.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ANMS(std::vector<KeyPoint>& keyPoint, std::vector<KeyPoint>& corners) {
	const int n = 500;
	const float robustC = 0.9F;

	vector<float> robustResponse;
	vector<KeyPoint> r;


	float globalMax = 0.0F;

	for (KeyPoint point : keyPoint) {
		float response = point.response;
		robustResponse.push_back(response*robustC);
		if (response > globalMax) {
			globalMax = response;
		}
	}

	globalMax *= robustC;

	for (KeyPoint point : keyPoint) {
		float response = point.response;
		if (response > globalMax) {
			r.push_back(KeyPoint(point.pt, 3, -1.0F, numeric_limits<float>::max()));
		}
		else {
			float minDist = numeric_limits<float>::max();
			for (int i = 0; i < keyPoint.size(); ++i) {
				float resP = robustResponse[i];
				if (resP > response) {
					float dist = getDistance(keyPoint[i], point);
					if (dist < minDist) {
						minDist = dist;
					}
				}
			}
			r.push_back(KeyPoint(point.pt, 3, -1.0F, minDist));
		}
	}

	sort(r.begin(), r.end(), compDist);
	if (r.size() > n) {
		corners.insert(corners.begin(), r.begin(), r.begin() + n - 1);
	}
	else {
		corners.insert(corners.begin(), r.begin(), r.end());
	}

}